

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

cTValue * lj_ctype_meta(CTState *cts,CTypeID id,MMS mm)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  cTValue *pcVar4;
  
  uVar2 = (ulong)id;
  do {
    uVar3 = uVar2;
    uVar1 = cts->tab[uVar3].info;
    uVar2 = (ulong)(uVar1 & 0xffff);
  } while ((uVar1 & 0xf0800000) == 0x20800000 || uVar1 >> 0x1c == 8);
  if ((uVar1 >> 0x1c == 2) &&
     ((*(uint *)((long)&cts->tab->info + (ulong)((uVar1 & 0xffff) << 4)) & 0xf0000000) == 0x60000000
     )) {
    pcVar4 = (cTValue *)
             ((ulong)(cts->miscmap->node).ptr32 +
             (ulong)(cts->miscmap->hmask & (cts->g->strempty).hash) * 0x18);
    do {
      if ((*(int *)((long)pcVar4 + 0xc) == -5) &&
         (&cts->g->strempty == (GCstr *)(ulong)pcVar4[1].u32.lo)) goto LAB_00137939;
      pcVar4 = (cTValue *)(ulong)pcVar4[2].u32.lo;
    } while (pcVar4 != (cTValue *)0x0);
    pcVar4 = (cTValue *)0x0;
  }
  else {
    pcVar4 = lj_tab_getinth(cts->miscmap,-(int)uVar3);
  }
LAB_00137939:
  if ((pcVar4 != (cTValue *)0x0) && ((pcVar4->field_2).it == 0xfffffff4)) {
    uVar1 = cts->g->gcroot[mm].gcptr32;
    pcVar4 = (cTValue *)
             ((ulong)*(uint *)((ulong)(pcVar4->u32).lo + 0x14) +
             (ulong)(*(uint *)((ulong)(pcVar4->u32).lo + 0x1c) & *(uint *)((ulong)uVar1 + 8)) * 0x18
             );
    do {
      if ((*(int *)((long)pcVar4 + 0xc) == -5) && (pcVar4[1].u32.lo == uVar1)) goto LAB_00137979;
      pcVar4 = (cTValue *)(ulong)pcVar4[2].u32.lo;
    } while (pcVar4 != (cTValue *)0x0);
    pcVar4 = (cTValue *)0x0;
LAB_00137979:
    if ((pcVar4 != (cTValue *)0x0) && ((pcVar4->field_2).it != 0xffffffff)) {
      return pcVar4;
    }
  }
  return (cTValue *)0x0;
}

Assistant:

cTValue *lj_ctype_meta(CTState *cts, CTypeID id, MMS mm)
{
  CType *ct = ctype_get(cts, id);
  cTValue *tv;
  while (ctype_isattrib(ct->info) || ctype_isref(ct->info)) {
    id = ctype_cid(ct->info);
    ct = ctype_get(cts, id);
  }
  if (ctype_isptr(ct->info) &&
      ctype_isfunc(ctype_get(cts, ctype_cid(ct->info))->info))
    tv = lj_tab_getstr(cts->miscmap, &cts->g->strempty);
  else
    tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
  if (tv && tvistab(tv) &&
      (tv = lj_tab_getstr(tabV(tv), mmname_str(cts->g, mm))) && !tvisnil(tv))
    return tv;
  return NULL;
}